

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O0

void __thiscall soplex::DSVectorBase<double>::setMax(DSVectorBase<double> *this,int newmax)

{
  int s;
  int in_ESI;
  Nonzero<double> *in_RDI;
  int len;
  int siz;
  int in_stack_0000002c;
  Nonzero<double> **in_stack_00000030;
  int local_24;
  
  s = SVectorBase<double>::size((SVectorBase<double> *)&in_RDI->idx);
  local_24 = in_ESI;
  if (in_ESI < s) {
    local_24 = s;
  }
  spx_realloc<soplex::Nonzero<double>*>(in_stack_00000030,in_stack_0000002c);
  SVectorBase<double>::setMem((SVectorBase<double> *)CONCAT44(in_ESI,s),local_24,in_RDI);
  SVectorBase<double>::set_size((SVectorBase<double> *)&in_RDI->idx,s);
  return;
}

Assistant:

inline
void DSVectorBase<Real>::setMax(int newmax)
{
   int siz = size();
   int len = (newmax < siz) ? siz : newmax;

   spx_realloc(theelem, len);
   setMem(len, theelem);
   // reset 'size' to old size since the above call to setMem() sets 'size' to 0
   set_size(siz);
}